

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityCapabilities.h
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::EntityCapabilities::EntityCapabilities
          (EntityCapabilities *this,EntityCapabilities *param_1)

{
  EntityCapabilities *param_1_local;
  EntityCapabilities *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase,&param_1->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__EntityCapabilities_0032eb58;
  this->field_0 = param_1->field_0;
  return;
}

Assistant:

class KDIS_EXPORT EntityCapabilities :  public DataTypeBase
{
protected:

    union
    {
        struct
        {
            KUINT32 m_AmmunitionSupply : 1;
            KUINT32 m_FuelSupply       : 1;
            KUINT32 m_RecoveryService  : 1;
            KUINT32 m_RepairService    : 1;
			KUINT32 m_ADSB             : 1;
            KUINT32 m_Unused           : 27;
        };
        KUINT32 m_ui16Data;
    };

public:

    static const KUINT16 ENTITY_CAPABILITIES_SIZE = 4;

    EntityCapabilities();

    EntityCapabilities(KDataStream &stream) noexcept(false);

    EntityCapabilities( KBOOL AmunitionSupply, KBOOL FuelSupply, KBOOL RecoveryService, KBOOL RepairService );

	EntityCapabilities( KBOOL AmunitionSupply, KBOOL FuelSupply, KBOOL RecoveryService, KBOOL RepairService, KBOOL ADSB );

    virtual ~EntityCapabilities();

    //************************************
    // FullName:    KDIS::DATA_TYPE::EntityCapabilities::SetHasAmmunitionSupply
    //              KDIS::DATA_TYPE::EntityCapabilities::HasAmmunitionSupply
    // Description: Does the entity have an ammunition supply
    // Parameter:   KBOOL HAS
    //************************************
    void SetHasAmmunitionSupply( KBOOL HAS );
    KBOOL HasAmmunitionSupply() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EntityCapabilities::SetHasFuelSupply
    //              KDIS::DATA_TYPE::EntityCapabilities::HasFuelSupply
    // Description: Does the entity have a fuel supply
    // Parameter:   KBOOL HAS
    //************************************
    void SetHasFuelSupply( KBOOL HAS );
    KBOOL HasFuelSupply() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EntityCapabilities::SetHasRecoveryService
    //              KDIS::DATA_TYPE::EntityCapabilities::HasRecoveryService
    // Description: Does the entity have a recovery service, such as towing
    // Parameter:   KBOOL HAS
    //************************************
    void SetHasRecoveryService( KBOOL HAS );
    KBOOL HasRecoveryService() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EntityCapabilities::SetHasRepairService
    //              KDIS::DATA_TYPE::EntityCapabilities::HasRepairService
    // Description: Does the entity have a repair service
    // Parameter:   KBOOL HAS
    //************************************
    void SetHasRepairService( KBOOL HAS );
    KBOOL HasRepairService() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EntityCapabilities::SetHasAutomaticDependentSurveillanceBroadcast
    //              KDIS::DATA_TYPE::EntityCapabilities::HasAutomaticDependentSurveillanceBroadcast
    // Description: Is the entity capable of Automatic Dependent Surveillance - Broadcast (ADS-B)?
    // Parameter:   KBOOL ADSB
    //************************************
	void SetHasAutomaticDependentSurveillanceBroadcast( KBOOL ADSB );
	KBOOL HasAutomaticDependentSurveillanceBroadcast() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EntityCapabilities::SetAllFields
    //              KDIS::DATA_TYPE::EntityCapabilities::GetAllFields
    // Description: 4 octet length field with all the bits set.
    // Parameter:   KUINT32 All
    //************************************
    void SetAllFields( KUINT32 All );
    KUINT32 GetAllFields() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EntityCapabilities::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EntityCapabilities::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::EntityCapabilities::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const EntityCapabilities & Value ) const;
    KBOOL operator != ( const EntityCapabilities & Value ) const;
}